

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O0

void ywalg2(double *x,int N,int p,double *phi,double *var)

{
  int M;
  double *acov;
  double *B;
  void *__ptr;
  double *A;
  double *C;
  double local_70;
  double b;
  double a;
  double *temp2;
  double *temp1;
  double *y;
  double *z;
  double *acf;
  int local_30;
  int j;
  int k;
  int lag;
  double *var_local;
  double *phi_local;
  int p_local;
  int N_local;
  double *x_local;
  
  M = p + 1;
  acov = (double *)malloc((long)M << 3);
  B = (double *)malloc((long)M << 3);
  __ptr = malloc((long)p << 3);
  A = (double *)malloc((long)p << 3);
  C = (double *)malloc(8);
  autocovar(x,N,acov,M);
  *var = *acov;
  *acov = 1.0;
  for (local_30 = 1; local_30 < M; local_30 = local_30 + 1) {
    acov[local_30] = acov[local_30] / *var;
  }
  local_70 = *acov;
  b = -acov[1];
  *B = b;
  for (local_30 = 0; local_30 < p + -1; local_30 = local_30 + 1) {
    local_70 = (-b * b + 1.0) * local_70;
    for (acf._4_4_ = local_30; -1 < acf._4_4_; acf._4_4_ = acf._4_4_ + -1) {
      A[local_30 - acf._4_4_] = acov[acf._4_4_ + 1];
    }
    mmult(A,B,C,1,local_30 + 1,1);
    b = -(*C + acov[local_30 + 2]) / local_70;
    for (acf._4_4_ = 0; acf._4_4_ <= local_30; acf._4_4_ = acf._4_4_ + 1) {
      *(double *)((long)__ptr + (long)acf._4_4_ * 8) = b * B[local_30 - acf._4_4_] + B[acf._4_4_];
    }
    for (acf._4_4_ = 0; acf._4_4_ <= local_30; acf._4_4_ = acf._4_4_ + 1) {
      B[acf._4_4_] = *(double *)((long)__ptr + (long)acf._4_4_ * 8);
    }
    B[local_30 + 1] = b;
  }
  for (acf._4_4_ = 0; acf._4_4_ < p; acf._4_4_ = acf._4_4_ + 1) {
    phi[acf._4_4_] = B[acf._4_4_] * -1.0;
  }
  mmult(acov + 1,phi,C,1,p,1);
  *var = *var * (1.0 - *C);
  free(acov);
  free(__ptr);
  free(B);
  free(A);
  free(C);
  return;
}

Assistant:

void ywalg2(double *x, int N, int p, double *phi,double *var) {
	int lag, k, j;
	double *acf, *z, *y, *temp1, *temp2;
	double a, b;
	// Same as ywalg except it also returns the variance value
	lag = p + 1;
	acf = (double*)malloc(sizeof(double)* lag);
	y = (double*)malloc(sizeof(double)* lag);
	z = (double*)malloc(sizeof(double)* p);
	temp1 = (double*)malloc(sizeof(double)* p);
	temp2 = (double*)malloc(sizeof(double)* 1);

	autocovar(x, N, acf, lag);
	*var = acf[0];
	acf[0] = 1.0;
	for (k = 1; k < lag; ++k) {
		acf[k] = acf[k] / *var;
	}
	b = acf[0];
	a = y[0] = -acf[1];

	for (k = 0; k < p - 1; ++k) {
		b = (1 - a*a) * b;
		for (j = k; j >= 0; --j) {
			temp1[k - j] = acf[j + 1];
		}
		mmult(temp1, y, temp2, 1, k + 1, 1);

		a = -(*temp2 + acf[k + 2]) / b;

		for (j = 0; j <= k; ++j) {
			z[j] = y[j] + a * y[k - j];
		}

		for (j = 0; j <= k; ++j) {
			y[j] = z[j];
		}
		y[k + 1] = a;

	}

	for (j = 0; j < p; ++j) {
		phi[j] = -1.0 * y[j];
	}
	mmult(acf + 1, phi, temp2, 1, p, 1);
	*var = *var * (1.0 - *temp2);

	free(acf);
	free(z);
	free(y);
	free(temp1);
	free(temp2);
}